

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O3

void TxToJSON(CTransaction *tx,uint256 hashBlock,UniValue *entry,Chainstate *active_chainstate,
             CTxUndo *txundo,TxVerbosity verbosity)

{
  int iVar1;
  pointer ppCVar2;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  uchar *puVar3;
  CBlockIndex *pCVar4;
  CBlockIndex *pCVar5;
  pointer pUVar6;
  pointer pUVar7;
  long in_FS_OFFSET;
  Chainstate *pCVar8;
  RecursiveMutex *pRVar9;
  bool bVar10;
  undefined1 in_stack_fffffffffffffd49 [15];
  _Alloc_hider in_stack_fffffffffffffd58;
  size_type in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd70 [56];
  pointer in_stack_fffffffffffffda8;
  undefined1 local_248 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<UniValue,_std::allocator<UniValue>_> local_1f8;
  pointer local_1e0 [2];
  undefined1 local_1d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<UniValue,_std::allocator<UniValue>_> local_180;
  long *local_168 [2];
  long local_158 [2];
  UniValue local_148;
  long *local_f0 [2];
  long local_e0 [2];
  UniValue local_d0;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p._0_1_ = 1;
  inline_check_non_fatal<bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp"
             ,0x3c,"TxToJSON","verbosity >= TxVerbosity::SHOW_DETAILS");
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  TxToUniv(tx,(uint256 *)&local_58,entry,true,txundo,verbosity);
  puVar3 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (&hashBlock,&stack0x00000028);
  if (puVar3 != &stack0x00000028) {
    pRVar9 = &cs_main;
    bVar10 = false;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffd40);
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"blockhash","");
    base_blob<256u>::GetHex_abi_cxx11_(&local_58,&hashBlock);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d0,&local_58);
    key._M_string_length = (size_type)pRVar9;
    key._M_dataplus._M_p = (pointer)active_chainstate;
    key.field_2._M_local_buf[0] = bVar10;
    key.field_2._1_15_ = in_stack_fffffffffffffd49;
    val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd60;
    val._0_8_ = in_stack_fffffffffffffd58._M_p;
    val.val._M_string_length = in_stack_fffffffffffffd68;
    val.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffffd70._0_16_;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffd70._16_24_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._40_8_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._48_8_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffda8;
    UniValue::pushKV(entry,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
      operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
    }
    pCVar8 = active_chainstate;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    pCVar4 = node::BlockManager::LookupBlockIndex(active_chainstate->m_blockman,&hashBlock);
    if (pCVar4 != (CBlockIndex *)0x0) {
      iVar1 = pCVar4->nHeight;
      if (((long)iVar1 < 0) ||
         (ppCVar2 = (active_chainstate->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
         (int)((ulong)((long)(active_chainstate->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <=
         iVar1)) {
        pCVar5 = (CBlockIndex *)0x0;
      }
      else {
        pCVar5 = ppCVar2[iVar1];
      }
      if (pCVar5 == pCVar4) {
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"confirmations","");
        local_58._M_dataplus._M_p._0_4_ =
             (int)((ulong)((long)(active_chainstate->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(active_chainstate->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - pCVar4->nHeight;
        UniValue::UniValue<int,_int,_true>(&local_148,(int *)&local_58);
        key_01._M_string_length = (size_type)pRVar9;
        key_01._M_dataplus._M_p = (pointer)pCVar8;
        key_01.field_2._M_local_buf[0] = bVar10;
        key_01.field_2._1_15_ = in_stack_fffffffffffffd49;
        val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd60;
        val_01._0_8_ = in_stack_fffffffffffffd58._M_p;
        val_01.val._M_string_length = in_stack_fffffffffffffd68;
        val_01.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd70._0_16_;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffd70._16_24_;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._40_8_;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._48_8_;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffda8;
        UniValue::pushKV(entry,key_01,val_01);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_148.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_148.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.val._M_dataplus._M_p != &local_148.val.field_2) {
          operator_delete(local_148.val._M_dataplus._M_p,
                          local_148.val.field_2._M_allocated_capacity + 1);
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        local_168[0] = local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"time","");
        local_58._M_dataplus._M_p = (pointer)(ulong)pCVar4->nTime;
        UniValue::UniValue<long,_long,_true>((UniValue *)(local_1d0 + 0x10),(long *)&local_58);
        key_02._M_string_length = (size_type)pRVar9;
        key_02._M_dataplus._M_p = (pointer)pCVar8;
        key_02.field_2._M_local_buf[0] = bVar10;
        key_02.field_2._1_15_ = in_stack_fffffffffffffd49;
        val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd60;
        val_02._0_8_ = in_stack_fffffffffffffd58._M_p;
        val_02.val._M_string_length = in_stack_fffffffffffffd68;
        val_02.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd70._0_16_;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffd70._16_24_;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._40_8_;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._48_8_;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffda8;
        UniValue::pushKV(entry,key_02,val_02);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_allocated_capacity != &local_1a8) {
          operator_delete((void *)local_1b8._M_allocated_capacity,
                          local_1a8._M_allocated_capacity + 1);
        }
        if (local_168[0] != local_158) {
          operator_delete(local_168[0],local_158[0] + 1);
        }
        pUVar7 = (pointer)local_1d0;
        local_1e0[0] = pUVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"blocktime","");
        local_58._M_dataplus._M_p = (pointer)(ulong)pCVar4->nTime;
        UniValue::UniValue<long,_long,_true>((UniValue *)(local_248 + 0x10),(long *)&local_58);
        key_03._M_string_length = (size_type)pRVar9;
        key_03._M_dataplus._M_p = (pointer)pCVar8;
        key_03.field_2._M_local_buf[0] = bVar10;
        key_03.field_2._1_15_ = in_stack_fffffffffffffd49;
        val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd60;
        val_03._0_8_ = in_stack_fffffffffffffd58._M_p;
        val_03.val._M_string_length = in_stack_fffffffffffffd68;
        val_03.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd70._0_16_;
        val_03.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffd70._16_24_;
        val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._40_8_;
        val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._48_8_;
        val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffda8;
        UniValue::pushKV(entry,key_03,val_03);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_210);
        pUVar6 = local_1e0[0];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_allocated_capacity != &local_220) {
          operator_delete((void *)local_230._M_allocated_capacity,
                          (ulong)(local_220._M_allocated_capacity + 1));
          pUVar6 = local_1e0[0];
        }
      }
      else {
        pUVar7 = (pointer)local_248;
        pUVar6 = pUVar7;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffda8,"confirmations","");
        local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
        UniValue::UniValue<int,_int,_true>((UniValue *)&stack0xfffffffffffffd50,(int *)&local_58);
        key_00._M_string_length = (size_type)pRVar9;
        key_00._M_dataplus._M_p = (pointer)pCVar8;
        key_00.field_2._M_local_buf[0] = bVar10;
        key_00.field_2._1_15_ = in_stack_fffffffffffffd49;
        val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd60;
        val_00._0_8_ = in_stack_fffffffffffffd58._M_p;
        val_00.val._M_string_length = in_stack_fffffffffffffd68;
        val_00.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd70._0_16_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffd70._16_24_;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._40_8_;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._48_8_;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pUVar6;
        UniValue::pushKV(entry,key_00,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                  ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffd90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffd78);
        if (in_stack_fffffffffffffd58._M_p != &stack0xfffffffffffffd68) {
          operator_delete(in_stack_fffffffffffffd58._M_p,in_stack_fffffffffffffd68 + 1);
        }
      }
      if (pUVar6 != pUVar7) {
        operator_delete(pUVar6,*(long *)pUVar7 + 1);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffd40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TxToJSON(const CTransaction& tx, const uint256 hashBlock, UniValue& entry,
                     Chainstate& active_chainstate, const CTxUndo* txundo = nullptr,
                     TxVerbosity verbosity = TxVerbosity::SHOW_DETAILS)
{
    CHECK_NONFATAL(verbosity >= TxVerbosity::SHOW_DETAILS);
    // Call into TxToUniv() in bitcoin-common to decode the transaction hex.
    //
    // Blockchain contextual information (confirmations and blocktime) is not
    // available to code in bitcoin-common, so we query them here and push the
    // data into the returned UniValue.
    TxToUniv(tx, /*block_hash=*/uint256(), entry, /*include_hex=*/true, txundo, verbosity);

    if (!hashBlock.IsNull()) {
        LOCK(cs_main);

        entry.pushKV("blockhash", hashBlock.GetHex());
        const CBlockIndex* pindex = active_chainstate.m_blockman.LookupBlockIndex(hashBlock);
        if (pindex) {
            if (active_chainstate.m_chain.Contains(pindex)) {
                entry.pushKV("confirmations", 1 + active_chainstate.m_chain.Height() - pindex->nHeight);
                entry.pushKV("time", pindex->GetBlockTime());
                entry.pushKV("blocktime", pindex->GetBlockTime());
            }
            else
                entry.pushKV("confirmations", 0);
        }
    }
}